

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O2

string * __thiscall
primesieve::CpuInfo::cpuName_abi_cxx11_(string *__return_storage_ptr__,CpuInfo *this)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  long lVar4;
  iterator iVar5;
  size_type *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ulong uVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_32c;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_32b;
  allocator<char> local_32a;
  allocator<char> local_329;
  string *local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  string local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  size_type local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  string line;
  string label;
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  ifstream file;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&file,"/proc/cpuinfo",_S_in);
  local_2f8 = &local_2e8;
  local_2f0 = 0;
  local_2e8._M_local_buf[0] = '\0';
  if ((abStack_218[*(long *)(_file + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    local_328 = local_298;
    local_320 = &__return_storage_ptr__->field_2;
    uVar8 = 0;
    do {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&file,(string *)&line);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
        std::__cxx11::string::~string((string *)&line);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_320;
        paVar7 = local_320;
        if (local_2f8 == &local_2e8) goto LAB_0011e839;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_2f8;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]);
        goto LAB_0011e83f;
      }
      if ((anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::cpuLabels_abi_cxx11_ ==
          '\0') {
        iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)
                                     ::cpuLabels_abi_cxx11_);
        if (iVar2 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&label,"model name",(allocator<char> *)local_258);
          std::__cxx11::string::string<std::allocator<char>>(local_298,"Processor",&local_329);
          std::__cxx11::string::string<std::allocator<char>>(local_278,"cpu",&local_32a);
          __l._M_len = 3;
          __l._M_array = &label;
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::
                   cpuLabels_abi_cxx11_,__l,&local_32b,&local_32c);
          lVar4 = 0x40;
          do {
            std::__cxx11::string::~string(local_298 + lVar4 + -0x20);
            lVar4 = lVar4 + -0x20;
          } while (lVar4 != -0x20);
          __cxa_atexit(std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::~set,(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::
                              cpuLabels_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::
                               cpuLabels_abi_cxx11_);
        }
      }
      lVar4 = std::__cxx11::string::find((char)&line,0x3a);
      local_318._M_string_length = 0;
      local_318.field_2._M_local_buf[0] = '\0';
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      if (lVar4 != -1) {
        std::__cxx11::string::substr((ulong)&label,(ulong)&line);
        anon_unknown.dwarf_fc64a::trimString(&label);
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::
                          cpuLabels_abi_cxx11_,&label);
        if (iVar5._M_node !=
            (_Base_ptr)
            ((anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::cpuLabels_abi_cxx11_ +
            8)) {
          std::__cxx11::string::substr((ulong)local_258,(ulong)&line);
          std::__cxx11::string::operator=((string *)&local_318,local_258);
          std::__cxx11::string::~string(local_258);
        }
        std::__cxx11::string::~string((string *)&label);
      }
      anon_unknown.dwarf_fc64a::trimString(&local_318);
      if (local_318._M_string_length == 0) {
LAB_0011e9d7:
        uVar8 = uVar8 + 1;
        bVar1 = true;
        if (10 < uVar8) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_320;
          paVar7 = &local_2e8;
          if (local_2f8 == paVar7) {
            local_320->_M_allocated_capacity =
                 CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]);
            *(undefined8 *)((long)local_320 + 8) = local_2e8._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_2f8;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]);
          }
          __return_storage_ptr__->_M_string_length = local_2f0;
          psVar6 = &local_2f0;
          local_2f8 = paVar7;
          goto LAB_0011ea3f;
        }
      }
      else {
        lVar4 = std::__cxx11::string::find_first_not_of((char *)&local_318,0x128144);
        if (lVar4 == -1) goto LAB_0011e9d7;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_320;
        paVar7 = &local_318.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p == paVar7) {
          local_320->_M_allocated_capacity =
               CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                        local_318.field_2._M_local_buf[0]);
          *(undefined8 *)((long)local_320 + 8) = local_318.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_318._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                        local_318.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = local_318._M_string_length;
        psVar6 = &local_318._M_string_length;
        local_318._M_dataplus._M_p = (pointer)paVar7;
LAB_0011ea3f:
        *psVar6 = 0;
        paVar7->_M_local_buf[0] = '\0';
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&local_318);
    } while (bVar1);
    std::__cxx11::string::~string((string *)&line);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar7 = &__return_storage_ptr__->field_2;
LAB_0011e839:
    paVar7->_M_allocated_capacity =
         CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]);
    *(undefined8 *)((long)paVar7 + 8) = local_2e8._8_8_;
LAB_0011e83f:
    local_2f8 = &local_2e8;
    __return_storage_ptr__->_M_string_length = local_2f0;
    local_2f0 = 0;
    local_2e8._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::~string((string *)&local_2f8);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

string CpuInfo::cpuName() const
{
  try
  {
    // On Linux we get the CPU name by parsing /proc/cpuinfo
    // which can be quite slow on PCs without fast SSD.
    // For this reason we don't initialize the CPU name at
    // startup but instead we lazy load it when needed.
    return getCpuName();
  }
  catch (exception&)
  {
    return {};
  }
}